

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O2

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  OfType OVar1;
  AssertionResult *pAVar2;
  Code colour;
  string *psVar3;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  allocator local_11;
  
  printSourceInfo(this);
  pAVar2 = this->result;
  (this->itMessage)._M_current =
       (this->messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = (pAVar2->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    std::__cxx11::string::string((string *)&local_1f8,"passed",(allocator *)&local_38);
    printResultType(this,BrightGreen,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    printOriginalExpression(this);
    printReconstructedExpression(this);
    if ((this->result->m_info).capturedExpression._M_string_length != 0) goto LAB_0016b995;
LAB_0016b80c:
    colour = None;
    goto LAB_0016b99b;
  case Info:
    std::__cxx11::string::string((string *)&local_d8,"info",(allocator *)&local_38);
    printResultType(this,None,&local_d8);
    psVar3 = &local_d8;
    goto LAB_0016b7a6;
  case Warning:
    std::__cxx11::string::string((string *)&local_b8,"warning",(allocator *)&local_38);
    printResultType(this,None,&local_b8);
    psVar3 = &local_b8;
LAB_0016b7a6:
    std::__cxx11::string::~string((string *)psVar3);
    printMessage(this);
LAB_0016b995:
    colour = FileName;
LAB_0016b99b:
    printRemainingMessages(this,colour);
    break;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 == ExpressionFailed) {
        if (((pAVar2->m_info).resultDisposition & SuppressFail) == 0) {
          std::__cxx11::string::string((string *)&local_1b8,"failed",(allocator *)&local_38);
          printResultType(this,BrightRed,&local_1b8);
          psVar3 = &local_1b8;
        }
        else {
          std::__cxx11::string::string((string *)&local_38," - but was ok",&local_11);
          std::operator+(&local_1d8,"failed",&local_38);
          printResultType(this,BrightGreen,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          psVar3 = &local_38;
        }
        std::__cxx11::string::~string((string *)psVar3);
        printOriginalExpression(this);
        printReconstructedExpression(this);
        goto LAB_0016b995;
      }
      if (OVar1 == ExplicitFailure) {
        std::__cxx11::string::string((string *)&local_98,"failed",(allocator *)&local_38);
        printResultType(this,BrightRed,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::string((string *)&local_78,"explicitly",(allocator *)&local_38);
        printIssue(this,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        goto LAB_0016b80c;
      }
      if (OVar1 == Exception) goto switchD_0016b6b0_caseD_ffffffff;
      if (OVar1 == ThrewException) {
        std::__cxx11::string::string((string *)&local_198,"failed",(allocator *)&local_38);
        printResultType(this,BrightRed,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::string
                  ((string *)&local_178,"unexpected exception with message:",(allocator *)&local_38)
        ;
        printIssue(this,&local_178);
        psVar3 = &local_178;
LAB_0016b878:
        std::__cxx11::string::~string((string *)psVar3);
        printMessage(this);
      }
      else {
        if (OVar1 != DidntThrowException) {
          if (OVar1 != FatalErrorCondition) {
            return;
          }
          std::__cxx11::string::string((string *)&local_158,"failed",(allocator *)&local_38);
          printResultType(this,BrightRed,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::string
                    ((string *)&local_138,"fatal error condition with message:",
                     (allocator *)&local_38);
          printIssue(this,&local_138);
          psVar3 = &local_138;
          goto LAB_0016b878;
        }
        std::__cxx11::string::string((string *)&local_118,"failed",(allocator *)&local_38);
        printResultType(this,BrightRed,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::string
                  ((string *)&local_f8,"expected exception, got none",(allocator *)&local_38);
        printIssue(this,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      printExpressionWas(this);
      goto LAB_0016b995;
    }
  case Unknown:
switchD_0016b6b0_caseD_ffffffff:
    std::__cxx11::string::string((string *)&local_58,"** internal error **",(allocator *)&local_38);
    printResultType(this,BrightRed,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::FatalErrorCondition:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "fatal error condition with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }